

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::toString_abi_cxx11_(char *value)

{
  char *in_RSI;
  string *in_RDI;
  string *in_stack_000000c8;
  allocator local_46;
  byte local_45;
  byte local_32;
  allocator local_31;
  string local_30 [48];
  
  local_32 = 0;
  local_45 = 0;
  if (in_RSI == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"{null string}",&local_46);
    std::allocator<char>::~allocator((allocator<char> *)&local_46);
  }
  else {
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string(local_30,in_RSI,&local_31);
    local_45 = 1;
    toString(in_stack_000000c8);
  }
  if ((local_45 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return in_RDI;
}

Assistant:

std::string toString( const char* const value ) {
    return value ? Catch::toString( std::string( value ) ) : std::string( "{null string}" );
}